

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LinkedReadsDatastore.cc
# Opt level: O2

ostream * operator<<(ostream *os,LinkedReadsDatastore *lrds)

{
  ostream *poVar1;
  allocator local_41;
  string local_40 [32];
  
  poVar1 = std::operator<<(os,"Linked Reads Datastore ");
  if ((lrds->name)._M_string_length == 0) {
    std::__cxx11::string::string(local_40,"unnamed",&local_41);
  }
  else {
    std::__cxx11::string::string(local_40,(string *)&lrds->name);
  }
  poVar1 = std::operator<<(poVar1,local_40);
  poVar1 = std::operator<<(poVar1,": ");
  poVar1 = std::ostream::_M_insert<unsigned_long>((ulong)poVar1);
  std::operator<<(poVar1," reads");
  std::__cxx11::string::~string(local_40);
  return os;
}

Assistant:

std::ostream &operator<<(std::ostream &os, const LinkedReadsDatastore &lrds) {
    os <<"Linked Reads Datastore "<< (lrds.name.empty() ? "unnamed":lrds.name) <<": "<<lrds.size()<<" reads";
    return os;
}